

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSGetNumMassSolves(void *arkode_mem,long *nmsolves)

{
  undefined8 *in_RSI;
  int retval;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = arkLs_AccessMassMem(in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                (ARKLsMassMem *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (local_4 == 0) {
    *in_RSI = in_stack_ffffffffffffffd8[10];
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkLSGetNumMassSolves(void *arkode_mem, long int *nmsolves)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure; set output value and return */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSGetNumMassSolves",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *nmsolves = arkls_mem->nmsolves;
  return(ARKLS_SUCCESS);
}